

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O0

rtr_signature_seg * rtr_bgpsec_new_signature_seg(uint8_t *ski,uint16_t sig_len,uint8_t *signature)

{
  long lVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  rtr_signature_seg *sig_seg;
  uint8_t *signature_local;
  uint16_t sig_len_local;
  uint8_t *ski_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ski_local = (uint8_t *)lrtr_malloc(0x28);
  if (ski_local == (uint8_t *)0x0) {
    ski_local = (uint8_t *)0x0;
  }
  else {
    pvVar2 = lrtr_calloc((ulong)sig_len,1);
    *(void **)(ski_local + 0x20) = pvVar2;
    if (*(long *)(ski_local + 0x20) == 0) {
      lrtr_free(ski_local);
      ski_local = (uint8_t *)0x0;
    }
    else {
      if (ski == (uint8_t *)0x0) {
        memset(ski_local + 8,0,0x14);
      }
      else {
        *(undefined8 *)(ski_local + 8) = *(undefined8 *)ski;
        *(undefined8 *)(ski_local + 0x10) = *(undefined8 *)(ski + 8);
        *(undefined4 *)(ski_local + 0x18) = *(undefined4 *)(ski + 0x10);
      }
      if (signature != (uint8_t *)0x0) {
        memcpy(*(void **)(ski_local + 0x20),signature,(ulong)sig_len);
      }
      *(uint16_t *)(ski_local + 0x1c) = sig_len;
      ski_local[0] = '\0';
      ski_local[1] = '\0';
      ski_local[2] = '\0';
      ski_local[3] = '\0';
      ski_local[4] = '\0';
      ski_local[5] = '\0';
      ski_local[6] = '\0';
      ski_local[7] = '\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (rtr_signature_seg *)ski_local;
  }
  __stack_chk_fail();
}

Assistant:

struct rtr_signature_seg *rtr_bgpsec_new_signature_seg(uint8_t *ski, uint16_t sig_len, uint8_t *signature)
{
	struct rtr_signature_seg *sig_seg = lrtr_malloc(sizeof(struct rtr_signature_seg));

	if (!sig_seg)
		return NULL;

	sig_seg->signature = lrtr_calloc(sig_len, 1);
	if (!sig_seg->signature) {
		lrtr_free(sig_seg);
		return NULL;
	}

	if (ski)
		memcpy(sig_seg->ski, ski, SKI_SIZE);
	else
		memset(sig_seg->ski, '\0', SKI_SIZE);

	if (signature)
		memcpy(sig_seg->signature, signature, sig_len);

	sig_seg->sig_len = sig_len;
	sig_seg->next = NULL;
	return sig_seg;
}